

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

QApplication * __thiscall QApplication::font(QApplication *this,QWidget *widget)

{
  Type *this_00;
  QMetaObject *pQVar1;
  char *pcVar2;
  Data<QHashPrivate::Node<QByteArray,_QFont>_> *pDVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  piter pVar5;
  QArrayDataPointer<char> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>::
            operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>
                        *)this);
  if (((this_00 != (Type *)0x0 && widget != (QWidget *)0x0) && (this_00->d != (Data *)0x0)) &&
     (this_00->d->size != 0)) {
    pQVar1 = (QMetaObject *)(*(code *)**(undefined8 **)widget)(widget);
    pcVar2 = (char *)QMetaObject::className();
    QByteArray::QByteArray((QByteArray *)&local_50,pcVar2,-1);
    pVar5 = (piter)QHash<QByteArray,_QFont>::constFindImpl<QByteArray>
                             (this_00,(QByteArray *)&local_50);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
    while( true ) {
      uVar4 = pVar5.bucket;
      pDVar3 = pVar5.d;
      if (((pQVar1 == &QWidget::staticMetaObject) ||
          (pDVar3 != (Data<QHashPrivate::Node<QByteArray,_QFont>_> *)0x0)) || (uVar4 != 0)) break;
      pQVar1 = (pQVar1->d).superdata.direct;
      pcVar2 = (char *)QMetaObject::className();
      QByteArray::QByteArray((QByteArray *)&local_50,pcVar2,-1);
      pVar5 = (piter)QHash<QByteArray,_QFont>::constFindImpl<QByteArray>
                               (this_00,(QByteArray *)&local_50);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
    }
    if (pDVar3 != (Data<QHashPrivate::Node<QByteArray,_QFont>_> *)0x0 || uVar4 != 0) {
      QFont::QFont((QFont *)this,
                   (QFont *)(pDVar3->spans[uVar4 >> 7].entries
                             [pDVar3->spans[uVar4 >> 7].offsets[(uint)pVar5.bucket & 0x7f]].storage.
                             data + 0x18));
      goto LAB_002bc422;
    }
  }
  QGuiApplication::font();
LAB_002bc422:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QFont QApplication::font(const QWidget *widget)
{
    typedef FontHash::const_iterator FontHashConstIt;

    FontHash *hash = app_fonts();

    if (widget && hash  && hash->size()) {
#ifdef Q_OS_MAC
        // short circuit for small and mini controls
        if (widget->testAttribute(Qt::WA_MacSmallSize)) {
            return hash->value(QByteArrayLiteral("QSmallFont"));
        } else if (widget->testAttribute(Qt::WA_MacMiniSize)) {
            return hash->value(QByteArrayLiteral("QMiniFont"));
        }
#endif
        // Return the font for the nearest registered superclass
        const QMetaObject *metaObj = widget->metaObject();
        FontHashConstIt it = hash->constFind(metaObj->className());
        const FontHashConstIt cend = hash->constEnd();
        while (it == cend && metaObj != &QWidget::staticMetaObject) {
            metaObj = metaObj->superClass();
            it = hash->constFind(metaObj->className());
        }
        if (it != cend)
            return it.value();
    }
    return font();
}